

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

string * __thiscall
wabt::Decompiler::Decompile_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this)

{
  ulong *puVar1;
  Enum EVar2;
  Module *pMVar3;
  Memory *args;
  pointer ppGVar4;
  Global *args_00;
  Table *args_01;
  DataSegment *pDVar5;
  Func *f;
  pointer pTVar6;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  size_type sVar7;
  LoadStoreTracking *this_00;
  char cVar8;
  bool bVar9;
  char cVar10;
  long *plVar11;
  int iVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char *args_1_00;
  ulong uVar13;
  char **ppcVar14;
  char **ppcVar15;
  Index IVar16;
  char (*args_2) [2];
  char cVar17;
  pointer ppDVar18;
  ulong uVar19;
  uint uVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stat;
  pointer ppMVar21;
  pointer ppGVar22;
  pointer ppTVar23;
  _Alloc_hider _Var24;
  string __str;
  string __str_1;
  string ds;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  string local_178;
  pointer local_158;
  string local_150;
  Index local_12c;
  LoadStoreTracking *local_128;
  string *local_120;
  _Base_ptr local_118;
  Func **local_110;
  pointer local_108;
  pointer local_100;
  AST local_f8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pMVar3 = (this->mc).module;
  ppMVar21 = (pMVar3->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppDVar18 = (pointer)(pMVar3->memories).
                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
  if ((pointer)ppMVar21 != ppDVar18) {
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_158 = ppDVar18;
    do {
      args = *ppMVar21;
      name.data_ = (args->name)._M_dataplus._M_p;
      name.size_ = (args->name)._M_string_length;
      IVar16 = (Index)args_1;
      bVar9 = CheckImportExport(this,__return_storage_ptr__,Memory,IVar16,name);
      cat<char[8],std::__cxx11::string>
                ((string *)&local_f8,(wabt *)"memory ",(char (*) [8])args,args_1);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
      if (local_f8.mc !=
          (ModuleContext *)
          ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
          8U)) {
        operator_delete(local_f8.mc);
      }
      if (!bVar9) {
        uVar19 = (args->page_limits).initial;
        cVar17 = '\x01';
        cVar10 = '\x01';
        if (9 < uVar19) {
          uVar13 = uVar19;
          cVar8 = '\x04';
          do {
            cVar10 = cVar8;
            if (uVar13 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_00148ae6;
            }
            if (uVar13 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_00148ae6;
            }
            if (uVar13 < 10000) goto LAB_00148ae6;
            bVar9 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar8 = cVar10 + '\x04';
          } while (bVar9);
          cVar10 = cVar10 + '\x01';
        }
LAB_00148ae6:
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_178,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_178._M_dataplus._M_p,(uint)local_178._M_string_length,uVar19);
        uVar19 = (args->page_limits).max;
        if (9 < uVar19) {
          uVar13 = uVar19;
          cVar10 = '\x04';
          do {
            cVar17 = cVar10;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_00148b6d;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_00148b6d;
            }
            if (uVar13 < 10000) goto LAB_00148b6d;
            bVar9 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar10 = cVar17 + '\x04';
          } while (bVar9);
          cVar17 = cVar17 + '\x01';
        }
LAB_00148b6d:
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_150,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar19);
        cat<char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                  ((string *)&local_f8,(wabt *)"(initial: ",(char (*) [11])&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                   (char (*) [8])&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ad36f,
                   (char (*) [2])CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
        if (local_f8.mc !=
            (ModuleContext *)
            ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
            8U)) {
          operator_delete(local_f8.mc);
        }
        ppDVar18 = local_158;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(IVar16 + 1);
      ppMVar21 = ppMVar21 + 1;
    } while ((pointer)ppMVar21 != ppDVar18);
  }
  pMVar3 = (this->mc).module;
  if ((pMVar3->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (pMVar3->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pMVar3 = (this->mc).module;
  ppGVar22 = (pMVar3->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar4 = (pMVar3->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar22 != ppGVar4) {
    IVar16 = 0;
    do {
      args_00 = *ppGVar22;
      ppcVar14 = (char **)(args_00->name)._M_string_length;
      name_00.data_ = (args_00->name)._M_dataplus._M_p;
      name_00.size_ = (args_00->name)._M_string_length;
      bVar9 = CheckImportExport(this,__return_storage_ptr__,Global,IVar16,name_00);
      EVar2 = (args_00->type).enum_;
      local_178._M_dataplus._M_p = "byte";
      switch(EVar2) {
      case I8U:
        local_178._M_dataplus._M_p = "ubyte";
        break;
      case I16U:
        local_178._M_dataplus._M_p = "ushort";
        break;
      case I32U:
        local_178._M_dataplus._M_p = "uint";
        break;
      case Exnref:
        local_178._M_dataplus._M_p = "exnref";
        break;
      case 0xffffffe9:
      case Exnref|Hostref:
      case 0xffffffeb:
      case Exnref|I8U:
      case 0xffffffed:
      case 0xfffffff1:
      case Funcref|Hostref:
      case 0xfffffff3:
      case Funcref|I8U:
      case 0xfffffff5:
      case Funcref|I16U:
      case Funcref|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case Hostref:
      case ~F64:
      case ~I8:
switchD_00148cc9_caseD_ffffffe9:
        local_178._M_dataplus._M_p = "ILLEGAL";
        break;
      case Nullref:
        local_178._M_dataplus._M_p = "nullref";
        break;
      case Anyref:
        local_178._M_dataplus._M_p = "anyref";
        break;
      case Funcref:
        local_178._M_dataplus._M_p = "funcref";
        break;
      case I16:
        local_178._M_dataplus._M_p = "short";
        break;
      case I8:
        break;
      case V128:
        local_178._M_dataplus._M_p = "simd";
        break;
      case F64:
        local_178._M_dataplus._M_p = "double";
        break;
      case F32:
        local_178._M_dataplus._M_p = "float";
        break;
      case I64:
        local_178._M_dataplus._M_p = "long";
        break;
      case I32:
        local_178._M_dataplus._M_p = "int";
        break;
      default:
        if (EVar2 == Void) {
          local_178._M_dataplus._M_p = "void";
        }
        else {
          if (EVar2 != Func) goto switchD_00148cc9_caseD_ffffffe9;
          local_178._M_dataplus._M_p = "func";
        }
      }
      args_1_00 = ":";
      cat<char[8],std::__cxx11::string,char[2],char_const*>
                ((string *)&local_f8,(wabt *)"global ",(char (*) [8])args_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
                 (char (*) [2])&local_178,ppcVar14);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
      if (local_f8.mc !=
          (ModuleContext *)
          ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
          8U)) {
        operator_delete(local_f8.mc);
      }
      if (!bVar9) {
        InitExp_abi_cxx11_(&local_178,this,&args_00->init_expr);
        cat<char[4],std::__cxx11::string>
                  ((string *)&local_f8,(wabt *)0x1ab1ea,(char (*) [4])&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1_00);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
        if (local_f8.mc !=
            (ModuleContext *)
            ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
            8U)) {
          operator_delete(local_f8.mc);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IVar16 = IVar16 + 1;
      ppGVar22 = ppGVar22 + 1;
    } while (ppGVar22 != ppGVar4);
  }
  pMVar3 = (this->mc).module;
  if ((pMVar3->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar3->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pMVar3 = (this->mc).module;
  ppTVar23 = (pMVar3->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_158 = (pointer)(pMVar3->tables).
                       super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
  if ((pointer)ppTVar23 != local_158) {
    IVar16 = 0;
    do {
      args_01 = *ppTVar23;
      ppcVar14 = (char **)(args_01->name)._M_string_length;
      name_01.data_ = (args_01->name)._M_dataplus._M_p;
      name_01.size_ = (args_01->name)._M_string_length;
      bVar9 = CheckImportExport(this,__return_storage_ptr__,Table,IVar16,name_01);
      EVar2 = (args_01->elem_type).enum_;
      local_178._M_dataplus._M_p = "byte";
      switch(EVar2) {
      case I8U:
        local_178._M_dataplus._M_p = "ubyte";
        break;
      case I16U:
        local_178._M_dataplus._M_p = "ushort";
        break;
      case I32U:
        local_178._M_dataplus._M_p = "uint";
        break;
      case Exnref:
        local_178._M_dataplus._M_p = "exnref";
        break;
      case 0xffffffe9:
      case Exnref|Hostref:
      case 0xffffffeb:
      case Exnref|I8U:
      case 0xffffffed:
      case 0xfffffff1:
      case Funcref|Hostref:
      case 0xfffffff3:
      case Funcref|I8U:
      case 0xfffffff5:
      case Funcref|I16U:
      case Funcref|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case Hostref:
      case ~F64:
      case ~I8:
switchD_00148ee8_caseD_ffffffe9:
        local_178._M_dataplus._M_p = "ILLEGAL";
        break;
      case Nullref:
        local_178._M_dataplus._M_p = "nullref";
        break;
      case Anyref:
        local_178._M_dataplus._M_p = "anyref";
        break;
      case Funcref:
        local_178._M_dataplus._M_p = "funcref";
        break;
      case I16:
        local_178._M_dataplus._M_p = "short";
        break;
      case I8:
        break;
      case V128:
        local_178._M_dataplus._M_p = "simd";
        break;
      case F64:
        local_178._M_dataplus._M_p = "double";
        break;
      case F32:
        local_178._M_dataplus._M_p = "float";
        break;
      case I64:
        local_178._M_dataplus._M_p = "long";
        break;
      case I32:
        local_178._M_dataplus._M_p = "int";
        break;
      default:
        if (EVar2 == Void) {
          local_178._M_dataplus._M_p = "void";
        }
        else {
          if (EVar2 != Func) goto switchD_00148ee8_caseD_ffffffe9;
          local_178._M_dataplus._M_p = "func";
        }
      }
      cat<char[7],std::__cxx11::string,char[2],char_const*>
                ((string *)&local_f8,(wabt *)"table ",(char (*) [7])args_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
                 (char (*) [2])&local_178,ppcVar14);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
      if (local_f8.mc !=
          (ModuleContext *)
          ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
          8U)) {
        operator_delete(local_f8.mc);
      }
      if (!bVar9) {
        uVar19 = (args_01->elem_limits).initial;
        cVar17 = '\x01';
        cVar10 = '\x01';
        if (9 < uVar19) {
          uVar13 = uVar19;
          cVar8 = '\x04';
          do {
            cVar10 = cVar8;
            if (uVar13 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_00149051;
            }
            if (uVar13 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_00149051;
            }
            if (uVar13 < 10000) goto LAB_00149051;
            bVar9 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar8 = cVar10 + '\x04';
          } while (bVar9);
          cVar10 = cVar10 + '\x01';
        }
LAB_00149051:
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_178,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_178._M_dataplus._M_p,(uint)local_178._M_string_length,uVar19);
        uVar19 = (args_01->elem_limits).max;
        if (9 < uVar19) {
          uVar13 = uVar19;
          cVar10 = '\x04';
          do {
            cVar17 = cVar10;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_001490d9;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_001490d9;
            }
            if (uVar13 < 10000) goto LAB_001490d9;
            bVar9 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar10 = cVar17 + '\x04';
          } while (bVar9);
          cVar17 = cVar17 + '\x01';
        }
LAB_001490d9:
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_150,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar19);
        cat<char[7],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                  ((string *)&local_f8,(wabt *)"(min: ",(char (*) [7])&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                   (char (*) [8])&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ad36f,
                   (char (*) [2])CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
        if (local_f8.mc !=
            (ModuleContext *)
            ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
            8U)) {
          operator_delete(local_f8.mc);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IVar16 = IVar16 + 1;
      ppTVar23 = ppTVar23 + 1;
    } while ((pointer)ppTVar23 != local_158);
  }
  pMVar3 = (this->mc).module;
  if ((pMVar3->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar3->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pMVar3 = (this->mc).module;
  ppDVar18 = (pMVar3->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_158 = (pMVar3->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (ppDVar18 != local_158) {
    do {
      pDVar5 = *ppDVar18;
      InitExp_abi_cxx11_(&local_178,this,&pDVar5->offset);
      cat<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[5]>
                ((string *)&local_f8,(wabt *)"data ",(char (*) [6])&pDVar5->name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(offset: ",
                 (char (*) [10])&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") = ",
                 (char (*) [5])CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
      if (local_f8.mc !=
          (ModuleContext *)
          ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
          8U)) {
        operator_delete(local_f8.mc);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      BinaryToString_abi_cxx11_((string *)&local_f8,this,&pDVar5->data);
      if ((Node *)(this->target_exp_width >> 1) <
          local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_f8.mc !=
          (ModuleContext *)
          ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
          8U)) {
        operator_delete(local_f8.mc);
      }
      ppDVar18 = ppDVar18 + 1;
    } while (ppDVar18 != local_158);
  }
  pMVar3 = (this->mc).module;
  if ((pMVar3->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar3->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pMVar3 = (this->mc).module;
  local_100 = (pMVar3->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_108 = (pMVar3->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_100 != local_108) {
    local_110 = &this->cur_func;
    local_128 = &this->lst;
    local_118 = &(this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header;
    IVar16 = 0;
    local_120 = __return_storage_ptr__;
    do {
      f = *local_100;
      this->cur_func = f;
      args_2 = (char (*) [2])(f->name)._M_dataplus._M_p;
      name_02.data_ = (f->name)._M_dataplus._M_p;
      name_02.size_ = (f->name)._M_string_length;
      local_12c = IVar16;
      cVar10 = CheckImportExport(this,__return_storage_ptr__,First,IVar16,name_02);
      AST::AST(&local_f8,&this->mc,f);
      this->cur_ast = &local_f8;
      if (!(bool)cVar10) {
        AST::Construct(&local_f8,&f->exprs,
                       (Index)((ulong)((long)(f->decl).sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(f->decl).sig.result_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2),true);
        this_00 = local_128;
        LoadStoreTracking::Track
                  (local_128,
                   local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        LoadStoreTracking::CheckLayouts(this_00);
      }
      cat<char[10],std::__cxx11::string,char[2]>
                (&local_178,(wabt *)"function ",(char (*) [10])f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b8066,
                 args_2);
      __return_storage_ptr__ = local_120;
      std::__cxx11::string::_M_append((char *)local_120,(ulong)local_178._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if (((long)(f->decl).sig.param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(f->decl).sig.param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
        uVar19 = 0;
        do {
          if (uVar19 != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          local_158 = (pointer)CONCAT44(local_158._4_4_,
                                        (f->decl).sig.param_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar19].enum_);
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          local_150._M_string_length = 0;
          local_150.field_2._M_local_buf[0] = '\0';
          uVar13 = uVar19 & 0xffffffff;
          do {
            uVar20 = (uint)uVar13;
            std::__cxx11::string::push_back((char)&local_150);
            uVar13 = (ulong)((int)(uVar13 / 0x1a) - 1);
          } while (0x19 < uVar20);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x1a60fe);
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          puVar1 = (ulong *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar1) {
            local_178.field_2._M_allocated_capacity = *puVar1;
            local_178.field_2._8_8_ = plVar11[3];
          }
          else {
            local_178.field_2._M_allocated_capacity = *puVar1;
            local_178._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_178._M_string_length = plVar11[1];
          *plVar11 = (long)puVar1;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          LocalDecl(&local_150,this,&local_178,local_158._0_4_);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_150._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < ((ulong)((long)(f->decl).sig.param_types.
                                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(f->decl).sig.param_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff)
                );
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pTVar6 = (f->decl).sig.result_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar12 = (int)((ulong)((long)(f->decl).sig.result_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar6) >> 2);
      if (iVar12 != 0) {
        if (iVar12 == 1) {
          EVar2 = pTVar6->enum_;
          ppcVar14 = (char **)(ulong)(uint)(EVar2 + ~(Func|I32U));
          if ((uint)(EVar2 + ~(Func|I32U)) < 0x20) {
            ppcVar15 = (char **)((long)&switchD_00149630::switchdataD_001aace0 +
                                (long)(int)(&switchD_00149630::switchdataD_001aace0)[(long)ppcVar14]
                                );
            local_150._M_dataplus._M_p = "byte";
            switch(ppcVar14) {
            case (char **)0x0:
              local_150._M_dataplus._M_p = "exnref";
              break;
            default:
switchD_00149630_caseD_ffffffe9:
              local_150._M_dataplus._M_p = "ILLEGAL";
              break;
            case (char **)0x6:
              local_150._M_dataplus._M_p = "nullref";
              break;
            case (char **)0x7:
              local_150._M_dataplus._M_p = "anyref";
              break;
            case (char **)0x8:
              local_150._M_dataplus._M_p = "funcref";
              break;
            case (char **)0x11:
              local_150._M_dataplus._M_p = "short";
              break;
            case (char **)0x12:
              break;
            case (char **)0x13:
              local_150._M_dataplus._M_p = "simd";
              break;
            case (char **)0x14:
              local_150._M_dataplus._M_p = "double";
              break;
            case (char **)0x15:
              local_150._M_dataplus._M_p = "float";
              break;
            case (char **)0x16:
              local_150._M_dataplus._M_p = "long";
              break;
            case (char **)0x17:
              local_150._M_dataplus._M_p = "int";
              break;
            case (char **)0x1c:
              local_150._M_dataplus._M_p = "ubyte";
              break;
            case (char **)0x1e:
              local_150._M_dataplus._M_p = "ushort";
              break;
            case (char **)0x1f:
              local_150._M_dataplus._M_p = "uint";
            }
          }
          else {
            ppcVar15 = ppcVar14;
            if (EVar2 == Void) {
              local_150._M_dataplus._M_p = "void";
            }
            else {
              if (EVar2 != Func) goto switchD_00149630_caseD_ffffffe9;
              local_150._M_dataplus._M_p = "func";
            }
          }
          cat<char[2],char_const*>(&local_178,(wabt *)":",(char (*) [2])&local_150,ppcVar15);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_178._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p);
          }
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          if (((long)(f->decl).sig.result_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(f->decl).sig.result_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
            uVar19 = 0;
            do {
              if (uVar19 != 0) {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              EVar2 = (f->decl).sig.result_types.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar19].enum_;
              switch(EVar2) {
              case I8U:
                break;
              case I16U:
                break;
              case I32U:
                break;
              case Exnref:
                break;
              case 0xffffffe9:
              case Exnref|Hostref:
              case 0xffffffeb:
              case Exnref|I8U:
              case 0xffffffed:
              case 0xfffffff1:
              case Funcref|Hostref:
              case 0xfffffff3:
              case Funcref|I8U:
              case 0xfffffff5:
              case Funcref|I16U:
              case Funcref|I32U:
              case ~I32U:
              case Any:
              case ~I64:
              case Hostref:
              case ~F64:
              case ~I8:
switchD_001496ad_caseD_ffffffe9:
                break;
              case Nullref:
                break;
              case Anyref:
                break;
              case Funcref:
                break;
              case I16:
                break;
              case I8:
                break;
              case V128:
                break;
              case F64:
                break;
              case F32:
                break;
              case I64:
                break;
              case I32:
                break;
              default:
                if ((EVar2 != Void) && (EVar2 != Func)) goto switchD_001496ad_caseD_ffffffe9;
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              uVar19 = uVar19 + 1;
            } while (uVar19 < ((ulong)((long)(f->decl).sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(f->decl).sig.result_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2 &
                              0xffffffff));
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      if (cVar10 == '\0') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        DecompileExpr((Value *)&local_178,this,
                      local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>
                      ._M_impl.super__Vector_impl_data._M_start,(Node *)0x0);
        IndentValue(this,(Value *)&local_178,this->indent_amount,(string_view)ZEXT816(0));
        sVar7 = local_178._M_string_length;
        for (_Var24._M_p = local_178._M_dataplus._M_p; _Var24._M_p != (pointer)sVar7;
            _Var24._M_p = _Var24._M_p + 0x20) {
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)_Var24._M_p);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_178);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      ModuleContext::EndFunc(&this->mc);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
                  *)local_128,
                 (_Link_type)(this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                );
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_118;
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_118;
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      IVar16 = local_12c + 1;
      *local_110 = (Func *)0x0;
      local_110[1] = (Func *)0x0;
      AST::~AST(&local_f8);
      local_100 = local_100 + 1;
    } while (local_100 != local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Decompile() {
    std::string s;
    // Memories.
    Index memory_index = 0;
    for (auto m : mc.module.memories) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Memory, memory_index, m->name);
      s += cat("memory ", m->name);
      if (!is_import) {
        s += cat("(initial: ", std::to_string(m->page_limits.initial),
                 ", max: ", std::to_string(m->page_limits.max), ")");
      }
      s += ";\n";
      memory_index++;
    }
    if (!mc.module.memories.empty())
      s += "\n";

    // Globals.
    Index global_index = 0;
    for (auto g : mc.module.globals) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Global, global_index, g->name);
      s += cat("global ", g->name, ":", GetDecompTypeName(g->type));
      if (!is_import) {
        s += cat(" = ", InitExp(g->init_expr));
      }
      s += ";\n";
      global_index++;
    }
    if (!mc.module.globals.empty())
      s += "\n";

    // Tables.
    Index table_index = 0;
    for (auto tab : mc.module.tables) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Table, table_index, tab->name);
      s += cat("table ", tab->name, ":", GetDecompTypeName(tab->elem_type));
      if (!is_import) {
        s += cat("(min: ", std::to_string(tab->elem_limits.initial),
                 ", max: ", std::to_string(tab->elem_limits.max), ")");
      }
      s += ";\n";
      table_index++;
    }
    if (!mc.module.tables.empty())
      s += "\n";

    // Data.
    for (auto dat : mc.module.data_segments) {
      s += cat("data ", dat->name, "(offset: ", InitExp(dat->offset), ") = ");
      auto ds = BinaryToString(dat->data);
      if (ds.size() > target_exp_width / 2) {
        s += "\n";
      }
      s += ds;
      s += ";\n";
    }
    if (!mc.module.data_segments.empty())
      s += "\n";

    // Code.
    Index func_index = 0;
    for (auto f : mc.module.funcs) {
      cur_func = f;
      auto is_import =
          CheckImportExport(s, ExternalKind::Func, func_index, f->name);
      AST ast(mc, f);
      cur_ast = &ast;
      if (!is_import) {
        ast.Construct(f->exprs, f->GetNumResults(), true);
        lst.Track(ast.exp_stack[0]);
        lst.CheckLayouts();
      }
      s += cat("function ", f->name, "(");
      for (Index i = 0; i < f->GetNumParams(); i++) {
        if (i)
          s += ", ";
        auto t = f->GetParamType(i);
        auto name = "$" + IndexToAlphaName(i);
        s += LocalDecl(name, t);
      }
      s += ")";
      if (f->GetNumResults()) {
        if (f->GetNumResults() == 1) {
          s += cat(":", GetDecompTypeName(f->GetResultType(0)));
        } else {
          s += ":(";
          for (Index i = 0; i < f->GetNumResults(); i++) {
            if (i)
              s += ", ";
            s += GetDecompTypeName(f->GetResultType(i));
          }
          s += ")";
        }
      }
      if (is_import) {
        s += ";";
      } else {
        s += " {\n";
        auto val = DecompileExpr(ast.exp_stack[0], nullptr);
        IndentValue(val, indent_amount, {});
        for (auto& stat : val.v) {
          s += stat;
          s += "\n";
        }
        s += "}";
      }
      s += "\n\n";
      mc.EndFunc();
      lst.Clear();
      func_index++;
      cur_ast = nullptr;
      cur_func = nullptr;
    }
    return s;
  }